

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O2

void __thiscall MathOp::PRandBit::forward(PRandBit *this)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  PRandFld *this_00;
  Mat MStack_78;
  Mat local_50;
  undefined8 local_28;
  undefined8 local_20;
  
  Op::reinit(&this->super_Op);
  iVar3 = (this->super_Op).forwardRound;
  if (iVar3 == 3) {
    iVar3 = Mat::count(this->a2_r);
    if (iVar3 < 4) {
      Mat::fill(this->a2,this->a2_r,this->a,this->a_r);
      Mat::sqrt_inv(&MStack_78,this->a2);
      Mat::operator=(this->a2,&MStack_78);
      Mat::~Mat(&MStack_78);
      Mat::dot(&local_50,this->a2,this->a);
      local_20 = 0;
      local_28 = 1;
      Mat::operator+(&MStack_78,&local_50,(ll128 *)&local_28);
      Mat::operator=(this->a2,&MStack_78);
      Mat::~Mat(&MStack_78);
      Mat::~Mat(&local_50);
      Mat::divideBy2(&MStack_78,this->a2);
      Mat::operator=(this->res,&MStack_78);
      Mat::~Mat(&MStack_78);
    }
    else {
      (this->super_Op).forwardRound = 0;
    }
  }
  else {
    if (iVar3 == 2) {
      (**(this->mulPub->super_Op)._vptr_Op)();
      this_00 = (PRandFld *)this->mulPub;
    }
    else {
      if (iVar3 != 1) {
        return;
      }
      (**(this->pRandFld->super_Op)._vptr_Op)();
      this_00 = this->pRandFld;
    }
    bVar2 = Op::forwardHasNext(&this_00->super_Op);
    if (bVar2) {
      piVar1 = &(this->super_Op).forwardRound;
      *piVar1 = *piVar1 + -1;
    }
  }
  return;
}

Assistant:

void MathOp::PRandBit::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
            pRandFld->forward();
            if (pRandFld->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 2:
            mulPub->forward();
            if (mulPub->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 3:
            if (a2_r->count() > REDUNDANCY) {
                forwardRound = 0;
                break;
            }
            Mat::fill(a2, a2_r, a, a_r);
            *a2 = a2->sqrt_inv();
            *a2 = a2->dot(*a) + 1;
            *res = a2->divideBy2();
            break;
    }
}